

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O1

void Imf_3_4::copyIntoFrameBuffer
               (char **readPtr,char *writePtr,char *endPtr,size_t xStride,bool fill,double fillValue
               ,Format format,PixelType typeInFrameBuffer,PixelType typeInFile)

{
  ushort *puVar1;
  uint *puVar2;
  char cVar3;
  half hVar4;
  uint uVar5;
  size_t i;
  char *pcVar6;
  char *pcVar7;
  ArgExc *this;
  long lVar8;
  float fVar9;
  uint uVar10;
  undefined3 in_register_00000081;
  size_t __n;
  float f;
  float local_2c;
  
  if (CONCAT31(in_register_00000081,fill) == 0) {
    if (format == XDR) {
      if (typeInFrameBuffer == FLOAT) {
        if (typeInFile == UINT) {
          if (writePtr <= endPtr) {
            do {
              Xdr::read<Imf_3_4::CharPtrIO,char_const*>(readPtr,(uint *)&local_2c);
              *(float *)writePtr = (float)(uint)local_2c;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
        else if (typeInFile == HALF) {
          if (writePtr <= endPtr) {
            do {
              lVar8 = 0;
              pcVar7 = *readPtr;
              do {
                *readPtr = pcVar7 + 1;
                *(char *)((long)&local_2c + lVar8) = *pcVar7;
                lVar8 = lVar8 + 1;
                pcVar7 = pcVar7 + 1;
              } while ((int)lVar8 != 2);
              *(undefined4 *)writePtr =
                   *(undefined4 *)(_imath_half_to_float_table + (ulong)local_2c._0_2_ * 4);
              writePtr = writePtr + xStride;
            } while (writePtr <= endPtr);
          }
        }
        else {
          if (typeInFile != FLOAT) {
            this = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
            goto LAB_0018bd44;
          }
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            Xdr::read<Imf_3_4::CharPtrIO,char_const*>(readPtr,(float *)writePtr);
          }
        }
      }
      else if (typeInFrameBuffer == HALF) {
        if (typeInFile == UINT) {
          if (writePtr <= endPtr) {
            do {
              Xdr::read<Imf_3_4::CharPtrIO,char_const*>(readPtr,(uint *)&local_2c);
              hVar4 = uintToHalf((uint)local_2c);
              *(uint16_t *)writePtr = hVar4._h;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
        else if (typeInFile == HALF) {
          if (writePtr <= endPtr) {
            pcVar7 = *readPtr;
            do {
              lVar8 = 0;
              pcVar6 = pcVar7;
              do {
                pcVar7 = pcVar6 + 1;
                *readPtr = pcVar7;
                *(char *)((long)&local_2c + lVar8) = *pcVar6;
                lVar8 = lVar8 + 1;
                pcVar6 = pcVar7;
              } while ((int)lVar8 != 2);
              *(uint16_t *)writePtr = local_2c._0_2_;
              writePtr = writePtr + xStride;
            } while (writePtr <= endPtr);
          }
        }
        else {
          if (typeInFile != FLOAT) {
            this = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
            goto LAB_0018bd44;
          }
          if (writePtr <= endPtr) {
            do {
              Xdr::read<Imf_3_4::CharPtrIO,char_const*>(readPtr,&local_2c);
              hVar4 = floatToHalf(local_2c);
              *(uint16_t *)writePtr = hVar4._h;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
      }
      else {
        if (typeInFrameBuffer != UINT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
LAB_0018bd44:
          __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        if (typeInFile == UINT) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            Xdr::read<Imf_3_4::CharPtrIO,char_const*>(readPtr,(uint *)writePtr);
          }
        }
        else if (typeInFile == HALF) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            lVar8 = 0;
            pcVar7 = *readPtr;
            do {
              *readPtr = pcVar7 + 1;
              *(char *)((long)&local_2c + lVar8) = *pcVar7;
              lVar8 = lVar8 + 1;
              pcVar7 = pcVar7 + 1;
            } while ((int)lVar8 != 2);
            uVar5 = halfToUint(local_2c._0_2_);
            *(uint *)writePtr = uVar5;
          }
        }
        else {
          if (typeInFile != FLOAT) {
            this = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
            goto LAB_0018bd44;
          }
          if (writePtr <= endPtr) {
            do {
              Xdr::read<Imf_3_4::CharPtrIO,char_const*>(readPtr,&local_2c);
              uVar5 = floatToUint(local_2c);
              *(uint *)writePtr = uVar5;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
      }
    }
    else if (typeInFrameBuffer == FLOAT) {
      if (typeInFile == UINT) {
        if (writePtr <= endPtr) {
          puVar2 = (uint *)*readPtr;
          do {
            *(float *)writePtr = (float)*puVar2;
            *readPtr = (char *)(puVar2 + 1);
            writePtr = (char *)((long)writePtr + xStride);
            puVar2 = puVar2 + 1;
          } while (writePtr <= endPtr);
        }
      }
      else if (typeInFile == HALF) {
        if (writePtr <= endPtr) {
          do {
            puVar1 = (ushort *)*readPtr;
            *(undefined4 *)writePtr =
                 *(undefined4 *)(_imath_half_to_float_table + (ulong)*puVar1 * 4);
            *readPtr = (char *)(puVar1 + 1);
            writePtr = writePtr + xStride;
          } while (writePtr <= endPtr);
        }
      }
      else {
        if (typeInFile != FLOAT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
          goto LAB_0018bd44;
        }
        for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
          lVar8 = 0;
          do {
            writePtr[lVar8] = (*readPtr)[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          *readPtr = *readPtr + 4;
        }
      }
    }
    else if (typeInFrameBuffer == HALF) {
      if (typeInFile == UINT) {
        for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
          hVar4 = uintToHalf(*(uint *)*readPtr);
          *(uint16_t *)writePtr = hVar4._h;
          *readPtr = *readPtr + 4;
        }
      }
      else if (typeInFile == HALF) {
        if (xStride == 2) {
          __n = (size_t)(((int)endPtr - (int)writePtr) + 2);
          memcpy(writePtr,*readPtr,__n);
          pcVar7 = *readPtr + __n;
        }
        else {
          if (endPtr < writePtr) {
            return;
          }
          pcVar7 = *readPtr;
          do {
            *(undefined2 *)writePtr = *(undefined2 *)pcVar7;
            pcVar7 = pcVar7 + 2;
            writePtr = writePtr + xStride;
          } while (writePtr <= endPtr);
        }
        *readPtr = pcVar7;
      }
      else {
        if (typeInFile != FLOAT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
          goto LAB_0018bd44;
        }
        for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
          hVar4 = floatToHalf(*(float *)*readPtr);
          *(uint16_t *)writePtr = hVar4._h;
          *readPtr = *readPtr + 4;
        }
      }
    }
    else {
      if (typeInFrameBuffer != UINT) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
        goto LAB_0018bd44;
      }
      if (typeInFile == UINT) {
        for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
          lVar8 = 0;
          do {
            writePtr[lVar8] = (*readPtr)[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          *readPtr = *readPtr + 4;
        }
      }
      else if (typeInFile == HALF) {
        for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
          uVar5 = halfToUint((half)*(uint16_t *)*readPtr);
          *(uint *)writePtr = uVar5;
          *readPtr = *readPtr + 2;
        }
      }
      else {
        if (typeInFile != FLOAT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
          goto LAB_0018bd44;
        }
        for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
          uVar5 = floatToUint(*(float *)*readPtr);
          *(uint *)writePtr = uVar5;
          *readPtr = *readPtr + 4;
        }
      }
    }
  }
  else if (typeInFrameBuffer == FLOAT) {
    if (writePtr <= endPtr) {
      do {
        *(float *)writePtr = (float)fillValue;
        writePtr = (char *)((long)writePtr + xStride);
      } while (writePtr <= endPtr);
    }
  }
  else if (typeInFrameBuffer == HALF) {
    fVar9 = ABS((float)fillValue);
    uVar5 = (uint)(float)fillValue >> 0x10 & 0x8000;
    if ((uint)fVar9 < 0x38800000) {
      if ((0x33000000 < (uint)fVar9) &&
         (uVar10 = (uint)fVar9 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar9 >> 0x17),
         uVar5 = uVar5 | uVar10 >> (0x7eU - cVar3 & 0x1f),
         0x80000000 < uVar10 << (cVar3 + 0xa2U & 0x1f))) {
        uVar5 = uVar5 + 1;
      }
    }
    else if ((uint)fVar9 < 0x7f800000) {
      if ((uint)fVar9 < 0x477ff000) {
        uVar5 = (int)fVar9 + 0x8000fff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd | uVar5;
      }
      else {
        uVar5 = uVar5 | 0x7c00;
      }
    }
    else {
      uVar5 = uVar5 | 0x7c00;
      if (fVar9 != INFINITY) {
        uVar10 = (uint)fVar9 >> 0xd & 0x3ff;
        uVar5 = uVar5 | uVar10 | (uint)(uVar10 == 0);
      }
    }
    for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
      *(short *)writePtr = (short)uVar5;
    }
  }
  else {
    if (typeInFrameBuffer != UINT) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
      goto LAB_0018bd44;
    }
    if (writePtr <= endPtr) {
      do {
        *(int *)writePtr = (int)(long)fillValue;
        writePtr = writePtr + xStride;
      } while (writePtr <= endPtr);
    }
  }
  return;
}

Assistant:

void
copyIntoFrameBuffer (
    const char*&       readPtr,
    char*              writePtr,
    char*              endPtr,
    size_t             xStride,
    bool               fill,
    double             fillValue,
    Compressor::Format format,
    PixelType          typeInFrameBuffer,
    PixelType          typeInFile)
{
    //
    // Copy a horizontal row of pixels from an input
    // file's line or tile buffer to a frame buffer.
    //

    if (fill)
    {
        //
        // The file contains no data for this channel.
        // Store a default value in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            {
                unsigned int fillVal = (unsigned int) (fillValue);

                while (writePtr <= endPtr)
                {
                    *(unsigned int*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            {
                half fillVal = half (fillValue);

                while (writePtr <= endPtr)
                {
                    *(half*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            {
                float fillVal = float (fillValue);

                while (writePtr <= endPtr)
                {
                    *(float*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else if (format == Compressor::XDR)
    {
        //
        // The line or tile buffer is in XDR format.
        //
        // Convert the pixels from the file's machine-
        // independent representation, and store the
        // results in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (
                                readPtr, *(unsigned int*) writePtr);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h;
                            Xdr::read<CharPtrIO> (readPtr, h);
                            *(unsigned int*) writePtr = halfToUint (h);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;
                            Xdr::read<CharPtrIO> (readPtr, f);
                            *(unsigned int*) writePtr = floatToUint (f);
                            writePtr += xStride;
                        }
                        break;

                    default:
                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;
                            Xdr::read<CharPtrIO> (readPtr, ui);
                            *(half*) writePtr = uintToHalf (ui);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (readPtr, *(half*) writePtr);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;
                            Xdr::read<CharPtrIO> (readPtr, f);
                            *(half*) writePtr = floatToHalf (f);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;
                            Xdr::read<CharPtrIO> (readPtr, ui);
                            *(float*) writePtr = float (ui);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h;
                            Xdr::read<CharPtrIO> (readPtr, h);
                            *(float*) writePtr = float (h);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (readPtr, *(float*) writePtr);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The line or tile buffer is in NATIVE format.
        // Copy the results into the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                writePtr[i] = readPtr[i];

                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h                    = *(half*) readPtr;
                            *(unsigned int*) writePtr = halfToUint (h);
                            readPtr += sizeof (half);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;

                            for (size_t i = 0; i < sizeof (float); ++i)
                                ((char*) &f)[i] = readPtr[i];

                            *(unsigned int*) writePtr = floatToUint (f);
                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;

                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;

                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                ((char*) &ui)[i] = readPtr[i];

                            *(half*) writePtr = uintToHalf (ui);
                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        // If we're tightly packed, just memcpy
                        if (xStride == sizeof (half))
                        {
                            int numBytes = endPtr - writePtr + sizeof (half);
                            memcpy (writePtr, readPtr, numBytes);
                            readPtr += numBytes;
                            writePtr += numBytes;
                        }
                        else
                        {
                            while (writePtr <= endPtr)
                            {
                                *(half*) writePtr = *(half*) readPtr;
                                readPtr += sizeof (half);
                                writePtr += xStride;
                            }
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;

                            for (size_t i = 0; i < sizeof (float); ++i)
                                ((char*) &f)[i] = readPtr[i];

                            *(half*) writePtr = floatToHalf (f);
                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;

                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                ((char*) &ui)[i] = readPtr[i];

                            *(float*) writePtr = float (ui);
                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h             = *(half*) readPtr;
                            *(float*) writePtr = float (h);
                            readPtr += sizeof (half);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            for (size_t i = 0; i < sizeof (float); ++i)
                                writePtr[i] = readPtr[i];

                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}